

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::getProgramInterface
          (SSBMemberOffsetAndAlignTest *this,GLuint test_case_index,
          ProgramInterface *program_interface,VaryingPassthrough *varying_passthrough)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  ShaderInterface *this_01;
  pointer __dest;
  uchar *data;
  ProgramInterface *this_02;
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  Interface *this_03;
  int iVar5;
  size_t data_size;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  string *this_04;
  uint value;
  Type TVar11;
  Type local_138;
  uint local_128;
  GLuint local_124;
  ulong local_120;
  SSBMemberOffsetAndAlignTest *local_118;
  ulong local_110;
  size_t position;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ulong local_a0;
  VaryingPassthrough *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ProgramInterface *local_70;
  string globals;
  GLchar buffer [16];
  
  this_04 = &globals;
  local_118 = this;
  local_70 = program_interface;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_04,
             "const int basic_size = BASIC_SIZE;\nconst int type_align = TYPE_ALIGN;\nconst int type_size  = TYPE_SIZE;\n"
             ,(allocator<char> *)&local_100);
  TVar11 = TestBase::getType((TestBase *)this_04,test_case_index);
  local_138 = TVar11;
  GVar1 = Utils::Type::GetTypeSize(TVar11.m_basic_type);
  GVar2 = Utils::Type::GetBaseAlignment(&local_138,false);
  local_98 = varying_passthrough;
  GVar3 = Utils::Type::GetBaseAlignment(&local_138,true);
  value = TVar11.m_n_columns * GVar2;
  GVar4 = Utils::roundUpToPowerOf2(value);
  local_88 = (ulong)GVar4;
  uVar6 = value % (GVar1 >> 1);
  iVar5 = (GVar1 >> 1) - uVar6;
  if (uVar6 == 0) {
    iVar5 = 0;
  }
  local_110 = (ulong)(iVar5 + value);
  local_128 = iVar5 + value + value;
  uVar6 = local_128 % (GVar4 * 2);
  iVar5 = GVar4 * 2 - uVar6;
  if (uVar6 == 0) {
    iVar5 = 0;
  }
  uVar6 = GVar4 * 3 + value;
  uVar7 = uVar6 % GVar2;
  iVar10 = GVar2 - uVar7;
  if (uVar7 == 0) {
    iVar10 = 0;
  }
  uVar6 = iVar10 + uVar6;
  uVar7 = value + uVar6;
  uVar8 = uVar7 % GVar2;
  iVar10 = GVar2 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar7 = iVar10 + uVar7;
  local_120 = (ulong)uVar7;
  uVar7 = uVar7 + value;
  uVar8 = uVar7 % GVar3;
  iVar10 = GVar3 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar7 = iVar10 + uVar7;
  local_78 = (ulong)uVar7;
  uVar7 = uVar7 + value;
  uVar8 = uVar7 % GVar3;
  iVar10 = GVar3 - uVar8;
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  uVar7 = iVar10 + uVar7;
  uVar8 = uVar7 + value;
  uVar9 = uVar8 % (GVar1 * 8);
  iVar10 = GVar1 * 8 - uVar9;
  if (uVar9 == 0) {
    iVar10 = 0;
  }
  local_124 = GVar3;
  local_80 = (ulong)GVar1;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100,&local_138);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,&local_138);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0,&local_138);
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,&local_138);
  uVar8 = uVar8 + iVar10;
  this_00 = &local_118->m_data;
  local_90 = (ulong)uVar6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,(ulong)(value + uVar8))
  ;
  uVar6 = local_128 + iVar5;
  __dest = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(__dest,local_100._M_impl.super__Vector_impl_data._M_start,
         (long)local_100._M_impl.super__Vector_impl_data._M_finish -
         (long)local_100._M_impl.super__Vector_impl_data._M_start);
  memcpy(__dest + (local_110 & 0xffffffff),local_b8._M_impl.super__Vector_impl_data._M_start,
         (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_b8._M_impl.super__Vector_impl_data._M_start);
  local_128 = uVar6;
  memcpy(__dest + uVar6,local_d0._M_impl.super__Vector_impl_data._M_start,
         (long)local_d0._M_impl.super__Vector_impl_data._M_finish -
         (long)local_d0._M_impl.super__Vector_impl_data._M_start);
  GVar2 = (GLuint)local_90;
  memcpy(__dest + (local_90 & 0xffffffff),local_e8._M_impl.super__Vector_impl_data._M_start,
         (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_e8._M_impl.super__Vector_impl_data._M_start);
  memcpy(__dest + (local_120 & 0xffffffff),local_e8._M_impl.super__Vector_impl_data._M_start,
         (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_e8._M_impl.super__Vector_impl_data._M_start);
  GVar1 = (GLuint)local_78;
  memcpy(__dest + (local_78 & 0xffffffff),local_d0._M_impl.super__Vector_impl_data._M_start,
         (long)local_d0._M_impl.super__Vector_impl_data._M_finish -
         (long)local_d0._M_impl.super__Vector_impl_data._M_start);
  memcpy(__dest + uVar7,local_b8._M_impl.super__Vector_impl_data._M_start,
         (long)local_b8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_b8._M_impl.super__Vector_impl_data._M_start);
  local_a0 = (ulong)uVar8;
  memcpy(__dest + uVar8,local_100._M_impl.super__Vector_impl_data._M_start,
         (long)local_100._M_impl.super__Vector_impl_data._M_finish -
         (long)local_100._M_impl.super__Vector_impl_data._M_start);
  position = 0;
  sprintf(buffer,"%d",local_80);
  Utils::replaceToken("BASIC_SIZE",&position,buffer,&globals);
  sprintf(buffer,"%d",local_88);
  Utils::replaceToken("TYPE_ALIGN",&position,buffer,&globals);
  sprintf(buffer,"%d",(ulong)value);
  Utils::replaceToken("TYPE_SIZE",&position,buffer,&globals);
  this_02 = local_70;
  this_03 = Utils::ProgramInterface::Block(local_70,"vs_buf_Block");
  Utils::Interface::Member
            (this_03,"at_first_offset","layout(offset = 0, align = 8 * basic_size)",0,0,&local_138,
             '\0',0,value,0);
  Utils::Interface::Member
            (this_03,"at_second_offset","layout(offset = type_size, align = basic_size / 2)",0,0,
             &local_138,'\0',0,value,(GLuint)local_110);
  Utils::Interface::Member
            (this_03,"at_third_offset","layout(align = 2 * type_align)",0,0,&local_138,'\0',0,value,
             local_128);
  Utils::Interface::Member
            (this_03,"at_fourth_offset","layout(offset = 3 * type_align + type_size)",0,0,&local_138
             ,'\0',0,value,GVar2);
  Utils::Interface::Member
            (this_03,"at_fifth_offset",glcts::fixed_sample_locations_values + 1,0,0,&local_138,'\0',
             0,value,(GLuint)local_120);
  Utils::Interface::Member
            (this_03,"at_sixth_offset",glcts::fixed_sample_locations_values + 1,0,0,&local_138,'\0',
             2,local_124 * 2,GVar1);
  Utils::Interface::Member
            (this_03,"at_eigth_offset","layout(align = 8 * basic_size)",0,0,&local_138,'\0',0,value,
             (GLuint)local_a0);
  this_01 = &this_02->m_vertex;
  std::__cxx11::string::_M_assign((string *)this_01);
  data = (local_118->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
  data_size = (long)(local_118->m_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)data;
  Utils::ShaderInterface::SSB<unsigned_char>
            (this_01,"vs_buf_block","layout (std140, binding = BINDING)",0,0,this_03,0,
             (GLint)data_size,0,data,data_size);
  Utils::ProgramInterface::CloneVertexInterface(this_02,local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_100);
  std::__cxx11::string::~string((string *)&globals);
  return;
}

Assistant:

void SSBMemberOffsetAndAlignTest::getProgramInterface(GLuint					 test_case_index,
													  Utils::ProgramInterface&   program_interface,
													  Utils::VaryingPassthrough& varying_passthrough)
{
	std::string globals = "const int basic_size = BASIC_SIZE;\n"
						  "const int type_align = TYPE_ALIGN;\n"
						  "const int type_size  = TYPE_SIZE;\n";

	Utils::Type  type		 = getType(test_case_index);
	GLuint		 basic_size  = Utils::Type::GetTypeSize(type.m_basic_type);
	const GLuint base_align  = type.GetBaseAlignment(false);
	const GLuint array_align = type.GetBaseAlignment(true);
	const GLuint base_stride = Utils::Type::CalculateStd140Stride(base_align, type.m_n_columns, 0);
	const GLuint type_align  = Utils::roundUpToPowerOf2(base_stride);

	/* Calculate offsets */
	const GLuint first_offset  = 0;
	const GLuint second_offset = type.GetActualOffset(base_stride, basic_size / 2);

#if WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, base_align);
	const GLuint fourth_offset  = type.GetActualOffset(third_offset + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, array_align);

#else /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	const GLuint third_offset   = type.GetActualOffset(second_offset + base_stride, 2 * type_align);
	const GLuint fourth_offset  = type.GetActualOffset(3 * type_align + base_stride, base_align);
	const GLuint fifth_offset   = type.GetActualOffset(fourth_offset + base_stride, base_align);
	const GLuint sixth_offset   = type.GetActualOffset(fifth_offset + base_stride, array_align);
	const GLuint seventh_offset = type.GetActualOffset(sixth_offset + base_stride, array_align);
	const GLuint eigth_offset   = type.GetActualOffset(seventh_offset + base_stride, 8 * basic_size);

#endif /* WRKARD_UNIFORMBLOCKMEMBEROFFSETANDALIGNTEST */

	/* Prepare data */
	const std::vector<GLubyte>& first  = type.GenerateData();
	const std::vector<GLubyte>& second = type.GenerateData();
	const std::vector<GLubyte>& third  = type.GenerateData();
	const std::vector<GLubyte>& fourth = type.GenerateData();

	m_data.resize(eigth_offset + base_stride);
	GLubyte* ptr = &m_data[0];
	memcpy(ptr + first_offset, &first[0], first.size());
	memcpy(ptr + second_offset, &second[0], second.size());
	memcpy(ptr + third_offset, &third[0], third.size());
	memcpy(ptr + fourth_offset, &fourth[0], fourth.size());
	memcpy(ptr + fifth_offset, &fourth[0], fourth.size());
	memcpy(ptr + sixth_offset, &third[0], third.size());
	memcpy(ptr + seventh_offset, &second[0], second.size());
	memcpy(ptr + eigth_offset, &first[0], first.size());

	/* Prepare globals */
	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", basic_size);
	Utils::replaceToken("BASIC_SIZE", position, buffer, globals);

	sprintf(buffer, "%d", type_align);
	Utils::replaceToken("TYPE_ALIGN", position, buffer, globals);

	sprintf(buffer, "%d", base_stride);
	Utils::replaceToken("TYPE_SIZE", position, buffer, globals);

	/* Prepare Block */
	Utils::Interface* vs_buf_block = program_interface.Block("vs_buf_Block");

	vs_buf_block->Member("at_first_offset", "layout(offset = 0, align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 first_offset);

	vs_buf_block->Member("at_second_offset", "layout(offset = type_size, align = basic_size / 2)",
						 0 /* expected_component */, 0 /* expected_location */, type, false /* normalized */,
						 0 /* n_array_elements */, base_stride, second_offset);

	vs_buf_block->Member("at_third_offset", "layout(align = 2 * type_align)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 third_offset);

	vs_buf_block->Member("at_fourth_offset", "layout(offset = 3 * type_align + type_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 fourth_offset);

	vs_buf_block->Member("at_fifth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 0 /* n_array_elements */, base_stride, fifth_offset);

	vs_buf_block->Member("at_sixth_offset", "", 0 /* expected_component */, 0 /* expected_location */, type,
						 false /* normalized */, 2 /* n_array_elements */, array_align * 2, sixth_offset);

	vs_buf_block->Member("at_eigth_offset", "layout(align = 8 * basic_size)", 0 /* expected_component */,
						 0 /* expected_location */, type, false /* normalized */, 0 /* n_array_elements */, base_stride,
						 eigth_offset);

	Utils::ShaderInterface& vs_si = program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Add globals */
	vs_si.m_globals = globals;

	/* Add uniform BLOCK */
	vs_si.SSB("vs_buf_block", "layout (std140, binding = BINDING)", 0, 0, vs_buf_block, 0,
			  static_cast<GLuint>(m_data.size()), 0, &m_data[0], m_data.size());

	/* */
	program_interface.CloneVertexInterface(varying_passthrough);
}